

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  Ptr<Catch::ThreadedSectionInfo> *pPVar1;
  _Alloc_hider _Var2;
  Ptr<Catch::ThreadedSectionInfo> *pPVar3;
  ThreadedSectionInfo *pTVar4;
  string *psVar5;
  ostream *poVar6;
  SourceLineInfo *other;
  __normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>
  __tmp;
  pointer pcVar7;
  Colour colourGuard;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  
  printOpenHeader(this,&((this->super_StreamingReporterBase).unusedTestCaseInfo.nullableValue)->name
                 );
  if ((this->super_StreamingReporterBase).currentSectionInfo.m_p == (ThreadedSectionInfo *)0x0) {
    pTVar4 = (ThreadedSectionInfo *)0x0;
  }
  else {
    Colour::Colour(&colourGuard,Headers);
    lineInfo.file.field_2._M_allocated_capacity = 0;
    lineInfo.file._M_dataplus._M_p = (pointer)0x0;
    lineInfo.file._M_string_length = 0;
    pPVar1 = &(this->super_StreamingReporterBase).currentSectionInfo;
    pPVar3 = pPVar1;
    while (_Var2._M_p = lineInfo.file._M_dataplus._M_p, _colourGuard_1 = pPVar3->m_p,
          _colourGuard_1 != (ThreadedSectionInfo *)0x0) {
      std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::
      push_back((vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>
                 *)&lineInfo,(value_type *)&colourGuard_1);
      pPVar3 = (Ptr<Catch::ThreadedSectionInfo> *)&_colourGuard_1->parent;
    }
    _colourGuard_1 = (ThreadedSectionInfo *)0x0;
    pcVar7 = (pointer)lineInfo.file._M_string_length;
    if (lineInfo.file._M_dataplus._M_p != (pointer)lineInfo.file._M_string_length) {
      for (; pcVar7 != _Var2._M_p; pcVar7 = pcVar7 + -8) {
        printHeaderString(this,(string *)(*(long *)(pcVar7 + -8) + 0x10),2);
      }
    }
    std::_Vector_base<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::
    ~_Vector_base((_Vector_base<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>
                   *)&lineInfo);
    Colour::~Colour(&colourGuard);
    pTVar4 = pPVar1->m_p;
  }
  other = &((this->super_StreamingReporterBase).unusedTestCaseInfo.nullableValue)->lineInfo;
  if (pTVar4 != (ThreadedSectionInfo *)0x0) {
    other = &(pTVar4->super_SectionInfo).lineInfo;
  }
  SourceLineInfo::SourceLineInfo(&lineInfo,other);
  if (lineInfo.file._M_string_length != 0) {
    poVar6 = (this->super_StreamingReporterBase).stream;
    psVar5 = getDashes_abi_cxx11_();
    poVar6 = std::operator<<(poVar6,(string *)psVar5);
    std::operator<<(poVar6,"\n");
    Colour::Colour(&colourGuard_1,FileName);
    poVar6 = operator<<((this->super_StreamingReporterBase).stream,&lineInfo);
    std::operator<<(poVar6,"\n");
    Colour::~Colour(&colourGuard_1);
  }
  poVar6 = (this->super_StreamingReporterBase).stream;
  psVar5 = getDots_abi_cxx11_();
  poVar6 = std::operator<<(poVar6,(string *)psVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&lineInfo);
  return;
}

Assistant:

void printTestCaseAndSectionHeader() {
            printOpenHeader( unusedTestCaseInfo->name );
            if( currentSectionInfo ) {
                Colour colourGuard( Colour::Headers );
                std::vector<ThreadedSectionInfo*> sections;
                for(    ThreadedSectionInfo* section = currentSectionInfo.get();
                        section;
                        section = section->parent )
                    sections.push_back( section );

                // Sections
                if( !sections.empty() ) {
                    typedef std::vector<ThreadedSectionInfo*>::const_reverse_iterator It;
                    for( It it = sections.rbegin(), itEnd = sections.rend(); it != itEnd; ++it )
                        printHeaderString( (*it)->name, 2 );

                }
            }
            SourceLineInfo lineInfo = currentSectionInfo
                                    ? currentSectionInfo->lineInfo
                                    : unusedTestCaseInfo->lineInfo;

            if( !lineInfo.empty() ){
                stream << getDashes() << "\n";
                Colour colourGuard( Colour::FileName );
                stream << lineInfo << "\n";
            }
            stream << getDots() << "\n" << std::endl;
        }